

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O0

TileOffsets * __thiscall
Imf_2_5::MultiPartInputFile::Data::createTileOffsets(Data *this,Header *header)

{
  int numYLevels_00;
  TileDescription *pTVar1;
  TileOffsets *pTVar2;
  TileOffsets *tileOffsets;
  TileDescription tileDesc;
  int numYLevels;
  int numXLevels;
  int *numYTiles;
  int *numXTiles;
  int maxY;
  int minY;
  int maxX;
  int minX;
  Box2i *dataWindow;
  TileDescription *in_stack_ffffffffffffff60;
  int **in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffffa0;
  int *numXTiles_00;
  int in_stack_ffffffffffffffb8;
  LevelMode in_stack_ffffffffffffffbc;
  TileOffsets *in_stack_ffffffffffffffc0;
  int *local_38;
  void *local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  Box2i *local_18;
  
  local_18 = Header::dataWindow((Header *)0x7f26e4);
  local_1c = (local_18->min).x;
  local_20 = (local_18->max).x;
  local_24 = (local_18->min).y;
  local_28 = (local_18->max).y;
  local_30 = (void *)0x0;
  local_38 = (int *)0x0;
  pTVar1 = Header::tileDescription((Header *)0x7f2758);
  numXTiles_00 = *(int **)pTVar1;
  numYLevels_00 = pTVar1->roundingMode;
  precalculateTileInfo
            (in_stack_ffffffffffffff60,(int)((ulong)&stack0xffffffffffffffc0 >> 0x20),
             (int)&stack0xffffffffffffffc0,(int)((ulong)&stack0xffffffffffffffc4 >> 0x20),
             (int)&stack0xffffffffffffffc4,&local_38,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff80);
  pTVar2 = (TileOffsets *)operator_new(0x28);
  TileOffsets::TileOffsets
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
             numYLevels_00,numXTiles_00,in_stack_ffffffffffffffa0);
  if (local_30 != (void *)0x0) {
    operator_delete__(local_30);
  }
  if (local_38 != (int *)0x0) {
    operator_delete__(local_38);
  }
  return pTVar2;
}

Assistant:

TileOffsets*
MultiPartInputFile::Data::createTileOffsets(const Header& header)
{
    //
    // Get the dataWindow information
    //

    const Box2i &dataWindow = header.dataWindow();
    int minX = dataWindow.min.x;
    int maxX = dataWindow.max.x;
    int minY = dataWindow.min.y;
    int maxY = dataWindow.max.y;

    //
    // Precompute level and tile information
    //

    int* numXTiles = nullptr;
    int* numYTiles = nullptr;
    int numXLevels, numYLevels;
    TileDescription tileDesc = header.tileDescription();
    try
    {

        precalculateTileInfo (tileDesc,
                            minX, maxX,
                            minY, maxY,
                            numXTiles, numYTiles,
                            numXLevels, numYLevels);

        TileOffsets* tileOffsets = new TileOffsets (tileDesc.mode,
                                                    numXLevels,
                                                    numYLevels,
                                                    numXTiles,
                                                    numYTiles);
        delete [] numXTiles;
        delete [] numYTiles;

        return tileOffsets;

    }
    catch(...)
    {
        delete [] numXTiles;
        delete [] numYTiles;
        throw;
    }

}